

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncheck.cpp
# Opt level: O2

bool validate(char *dirname)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *__dest;
  ostream *poVar8;
  void *pvVar9;
  int i;
  ulong uVar10;
  bool bVar11;
  int i_2;
  int i_1;
  ulong uVar12;
  char *__s;
  allocator<char> local_d5;
  undefined4 local_d4;
  void *local_d0;
  char *local_c8;
  dirent **entry_list;
  string_view local_b8;
  long local_a8;
  size_t local_a0;
  long local_98;
  ParsedJson pj;
  
  local_a0 = strlen(dirname);
  uVar4 = scandir(dirname,(dirent ***)&entry_list,(__selector *)0x0,alphasort);
  if ((int)uVar4 < 0) {
    bVar11 = false;
    fprintf(_stderr,"error accessing %s \n",dirname);
  }
  else if (uVar4 == 0) {
    bVar11 = false;
    printf("nothing in dir %s \n",dirname);
  }
  else {
    uVar12 = (ulong)uVar4;
    local_d0 = operator_new__(uVar12);
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      *(undefined1 *)((long)local_d0 + uVar10) = 1;
    }
    sVar6 = strlen(dirname);
    if (sVar6 < 2) {
      local_d4 = 0;
    }
    else {
      local_d4 = (undefined4)CONCAT71((int7)(sVar6 >> 8),dirname[sVar6 - 1] != '/');
    }
    local_98 = local_a0 + 2;
    bVar11 = true;
    local_a8 = 0;
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      __s = entry_list[uVar10]->d_name;
      pcVar7 = strrchr(__s,0x2e);
      if (pcVar7 != (char *)0x0) {
        iVar5 = strcmp(pcVar7,".json");
        if (iVar5 == 0) {
          printf("validating: file %s ",__s);
          fflush((FILE *)0x0);
          sVar6 = strlen(__s);
          __dest = (char *)malloc(sVar6 + local_98);
          strcpy(__dest,dirname);
          pcVar7 = __dest + local_a0;
          if ((char)local_d4 != '\0') {
            *pcVar7 = '/';
            pcVar7 = pcVar7 + 1;
          }
          local_c8 = __dest;
          strcpy(pcVar7,__s);
          local_b8._M_len = 0;
          local_b8._M_str = (char *)0x0;
          std::__cxx11::string::string<std::allocator<char>>((string *)&pj,local_c8,&local_d5);
          local_b8 = (string_view)get_corpus((string *)&pj);
          std::__cxx11::string::~string((string *)&pj);
          ParsedJson::ParsedJson(&pj);
          cVar1 = ParsedJson::allocateCapacity((ulong)&pj,local_b8._M_len);
          if (cVar1 == '\0') {
            poVar8 = std::operator<<((ostream *)&std::cerr,"can\'t allocate memory");
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          else {
            bVar2 = json_parse(&local_b8,&pj,true);
            free(local_b8._M_str);
            pcVar7 = "invalid";
            if (bVar2) {
              pcVar7 = "ok";
            }
            puts(pcVar7);
            bVar3 = contains("EXCLUDE",__s);
            if (!bVar3) {
              local_a8 = local_a8 + 1;
              bVar3 = startsWith("pass",__s);
              if (bVar3) {
                pcVar7 = "warning: file %s should pass but it fails.\n";
                if (!bVar2) {
LAB_0010262c:
                  *(undefined1 *)((long)local_d0 + uVar10) = 0;
                  bVar11 = false;
                  printf(pcVar7,__s);
                }
              }
              else {
                bVar3 = startsWith("fail",__s);
                pcVar7 = "warning: file %s should fail but it passes.\n";
                if (bVar2 && bVar3) goto LAB_0010262c;
              }
            }
            free(local_c8);
          }
          ParsedJson::~ParsedJson(&pj);
          if (cVar1 == '\0') {
            return false;
          }
        }
      }
    }
    printf("%zu files checked.\n",local_a8);
    if (bVar11) {
      puts("All ok!");
    }
    else {
      fwrite("There were problems! Consider reviewing the following files:\n",0x3d,1,_stderr);
      pvVar9 = local_d0;
      for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        if (*(char *)((long)pvVar9 + uVar10) == '\0') {
          fprintf(_stderr,"%s \n",entry_list[uVar10]->d_name);
          pvVar9 = local_d0;
        }
      }
    }
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      free(entry_list[uVar10]);
    }
    free(entry_list);
    operator_delete__(local_d0);
  }
  return bVar11;
}

Assistant:

bool validate(const char *dirname) {
  bool everythingfine = true;
  const char *extension = ".json";
  size_t dirlen = strlen(dirname);
  struct dirent **entry_list;
  int c = scandir(dirname, &entry_list, nullptr, alphasort);
  if (c < 0) {
    fprintf(stderr, "error accessing %s \n", dirname);
    return false;
  }
  if (c == 0) {
    printf("nothing in dir %s \n", dirname);
    return false;
  }
  bool * isfileasexpected = new bool[c];
  for(int i = 0; i < c; i++) { isfileasexpected[i] = true;
}
  size_t howmany = 0;
  bool needsep = (strlen(dirname) > 1) && (dirname[strlen(dirname) - 1] != '/');
  for (int i = 0; i < c; i++) {
    const char *name = entry_list[i]->d_name;
    if (hasExtension(name, extension)) {
      printf("validating: file %s ", name);
      fflush(nullptr);
      size_t filelen = strlen(name);
      char *fullpath = static_cast<char *>(malloc(dirlen + filelen + 1 + 1));
      strcpy(fullpath, dirname);
      if (needsep) {
        fullpath[dirlen] = '/';
        strcpy(fullpath + dirlen + 1, name);
      } else {
        strcpy(fullpath + dirlen, name);
      }
      std::string_view p;
      try {
        p = get_corpus(fullpath);
      } catch (const std::exception& e) {
        std::cerr << "Could not load the file " << fullpath << std::endl;
        return EXIT_FAILURE;
      }
      ParsedJson pj;
      bool allocok = pj.allocateCapacity(p.size(), 1024);
      if(!allocok) {
        std::cerr << "can't allocate memory"<<std::endl;
        return false;
      }
      ++howmany;
      bool isok = json_parse(p, pj);
      aligned_free((void*)p.data());
      printf("%s\n", isok ? "ok" : "invalid");
      if(contains("EXCLUDE",name)) {
        // skipping
        howmany--;
      } else if (startsWith("pass", name)) {
        if (!isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should pass but it fails.\n", name);
          everythingfine = false;
        }
      } else if (startsWith("fail", name)) {
        if (isok) {
          isfileasexpected[i] = false;
          printf("warning: file %s should fail but it passes.\n", name);
          everythingfine = false;
        }
      }
      free(fullpath);
    }
  }
  printf("%zu files checked.\n", howmany);
  if(everythingfine) {
    printf("All ok!\n");
  } else {
    fprintf(stderr, "There were problems! Consider reviewing the following files:\n");
    for(int i = 0; i < c; i++) {
      if(!isfileasexpected[i]) { fprintf(stderr, "%s \n", entry_list[i]->d_name);
}
    }
  }
  for (int i = 0; i < c; ++i) {
    free(entry_list[i]);
}
  free(entry_list);
  delete[] isfileasexpected;
  return everythingfine;
}